

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linktimeplugin.hpp
# Opt level: O1

vector<Animal_*,_std::allocator<Animal_*>_> * linktimeplugin::RegistrarBase<Animal>::plugins(void)

{
  undefined8 *puVar1;
  iterator __position;
  Animal *in_RAX;
  vector<Animal*,std::allocator<Animal*>> *in_RDI;
  undefined8 *puVar2;
  Animal *local_28;
  
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  if (registrars_ != (undefined8 *)0x0) {
    puVar1 = (undefined8 *)registrars_[1];
    local_28 = in_RAX;
    for (puVar2 = (undefined8 *)*registrars_; puVar2 != puVar1; puVar2 = puVar2 + 1) {
      local_28 = (Animal *)(**(code **)(*(long *)*puVar2 + 0x10))();
      __position._M_current = *(Animal ***)(in_RDI + 8);
      if (__position._M_current == *(Animal ***)(in_RDI + 0x10)) {
        std::vector<Animal*,std::allocator<Animal*>>::_M_realloc_insert<Animal*>
                  (in_RDI,__position,&local_28);
      }
      else {
        *__position._M_current = local_28;
        *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) + 8;
      }
    }
  }
  return (vector<Animal_*,_std::allocator<Animal_*>_> *)in_RDI;
}

Assistant:

static std::vector<BASE*> plugins() {
            std::vector<BASE*> ret;

            if (registrars_) {
                for(auto r : *registrars_) {
                    ret.push_back(&(*r)());
                }
            }

            return ret;
        }